

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.cpp
# Opt level: O0

void __thiscall
sqlcheck::TestSuite_JoinEqualityTest_Test::TestSuite_JoinEqualityTest_Test
          (TestSuite_JoinEqualityTest_Test *this)

{
  TestSuite_JoinEqualityTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestSuite_JoinEqualityTest_Test_00285438;
  return;
}

Assistant:

TEST(TestSuite, JoinEqualityTest) {
    Configuration default_conf;
    default_conf.testing_mode = true;
    default_conf.verbose = false;

    std::unique_ptr<std::istringstream> stream(new std::istringstream());
    stream->str(
            "SELECT baz.id\n"
            "FROM foo\n"
            "LEFT JOIN bar ON bar\n"
            "JOIN baz ON baz = foo.baz;"
    );

    default_conf.test_stream.reset(stream.release());

    Check(default_conf);

}